

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O2

value hello_world_class_impl_interface_static_await
                (klass cls,class_impl impl,method m,void **args,size_t size,
                class_resolve_callback resolve,class_reject_callback reject,void *ctx)

{
  return (value)0x0;
}

Assistant:

value hello_world_class_impl_interface_static_await(klass cls, class_impl impl, method m, class_args args, size_t size, class_resolve_callback resolve, class_reject_callback reject, void *ctx)
{
	// TODO
	(void)cls;
	(void)impl;
	(void)m;
	(void)args;
	(void)size;
	(void)resolve;
	(void)reject;
	(void)ctx;

	return NULL;
}